

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O2

QString * __thiscall QProcEnvValue::string(QString *__return_storage_ptr__,QProcEnvValue *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->stringValue).d.size == 0) && ((this->byteValue).d.size != 0)) {
    QString::fromLocal8Bit<void>((QString *)&local_48,&this->byteValue);
    pDVar2 = (this->stringValue).d.d;
    pcVar3 = (this->stringValue).d.ptr;
    (this->stringValue).d.d = local_48.d;
    (this->stringValue).d.ptr = local_48.ptr;
    qVar1 = (this->stringValue).d.size;
    (this->stringValue).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&(this->stringValue).d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString string() const
    {
        if (stringValue.isEmpty() && !byteValue.isEmpty())
            stringValue = QString::fromLocal8Bit(byteValue);
        return stringValue;
    }